

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_page_element * nk_create_page_element(nk_context *ctx)

{
  nk_page *pnVar1;
  nk_page_element *ptr;
  ulong uVar2;
  
  ptr = ctx->freelist;
  if (ptr == (nk_page_element *)0x0) {
    if (ctx->use_pool == 0) {
      ptr = (nk_page_element *)nk_buffer_alloc(&ctx->memory,NK_BUFFER_BACK,0x1c8,8);
      if (ptr == (nk_page_element *)0x0) {
        return (nk_page_element *)0x0;
      }
    }
    else {
      pnVar1 = (ctx->pool).pages;
      if ((pnVar1 == (nk_page *)0x0) ||
         (uVar2 = (ulong)pnVar1->size, (ctx->pool).capacity <= pnVar1->size)) {
        uVar2 = 0;
        if ((ctx->pool).type == NK_BUFFER_FIXED) {
          return (nk_page_element *)0x0;
        }
        pnVar1 = (nk_page *)
                 (*(ctx->pool).alloc.alloc)((ctx->pool).alloc.userdata,(void *)0x0,0x1d58);
        pnVar1->next = (ctx->pool).pages;
        (ctx->pool).pages = pnVar1;
        pnVar1->size = 0;
      }
      pnVar1->size = (int)uVar2 + 1;
      ptr = pnVar1->win + uVar2;
    }
  }
  else {
    ctx->freelist = ptr->next;
  }
  nk_zero(ptr,0x1c8);
  ptr->next = (nk_page_element *)0x0;
  ptr->prev = (nk_page_element *)0x0;
  return ptr;
}

Assistant:

NK_INTERN struct nk_page_element*
nk_create_page_element(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    if (ctx->freelist) {
        /* unlink page element from free list */
        elem = ctx->freelist;
        ctx->freelist = elem->next;
    } else if (ctx->use_pool) {
        /* allocate page element from memory pool */
        elem = nk_pool_alloc(&ctx->pool);
        NK_ASSERT(elem);
        if (!elem) return 0;
    } else {
        /* allocate new page element from the back of the fixed size memory buffer */
        NK_STORAGE const nk_size size = sizeof(struct nk_page_element);
        NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_page_element);
        elem = (struct nk_page_element*)nk_buffer_alloc(&ctx->memory, NK_BUFFER_BACK, size, align);
        NK_ASSERT(elem);
        if (!elem) return 0;
    }
    nk_zero_struct(*elem);
    elem->next = 0;
    elem->prev = 0;
    return elem;
}